

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::_update_visibility(Group *this,GroupState *state,View *view)

{
  bool bVar1;
  Group *pGVar2;
  mapped_type *pmVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  Group *local_50;
  Group *local_48;
  Group *local_40;
  Group *local_38;
  Group *local_30;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  bool cov;
  bool view_is_visible;
  View *pVStack_20;
  bool view_was_visible;
  View *view_local;
  GroupState *state_local;
  Group *this_local;
  
  pVStack_20 = view;
  view_local = (View *)state;
  state_local = (GroupState *)this;
  fVar4 = View::get_vis(view);
  fVar5 = get_vis_thr(this);
  local_21 = fVar5 < fVar4;
  dVar6 = View::update_vis(pVStack_20);
  fVar4 = get_vis_thr(this);
  local_22 = (double)fVar4 < dVar6;
  bVar1 = View::get_cov(pVStack_20);
  local_23 = bVar1;
  if ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 1) == 0) ||
     (((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x10000) ==
      0)) {
    if ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x100) !=
         0) && ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i &
                 0x1000000) != 0 && ((local_22 & 1) != 0)))) {
      pGVar2 = core::P::operator_cast_to_Group_((P *)&(pVStack_20->super_View).object);
      local_50 = this;
      pmVar3 = std::
               unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
               ::operator[](&pGVar2->viewing_groups,&local_50);
      *pmVar3 = bVar1;
    }
  }
  else if ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x100)
            == 0) ||
          (((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i &
           0x1000000) == 0)) {
    pGVar2 = core::P::operator_cast_to_Group_((P *)&(pVStack_20->super_View).object);
    local_30 = this;
    std::
    unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
    ::erase(&pGVar2->viewing_groups,&local_30);
  }
  else if ((local_21 & 1) == 0) {
    if ((local_22 & 1) != 0) {
      pGVar2 = core::P::operator_cast_to_Group_((P *)&(pVStack_20->super_View).object);
      local_38 = this;
      pmVar3 = std::
               unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
               ::operator[](&pGVar2->viewing_groups,&local_38);
      *pmVar3 = bVar1;
    }
  }
  else if ((local_22 & 1) == 0) {
    pGVar2 = core::P::operator_cast_to_Group_((P *)&(pVStack_20->super_View).object);
    local_40 = this;
    std::
    unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
    ::erase(&pGVar2->viewing_groups,&local_40);
  }
  else {
    pGVar2 = core::P::operator_cast_to_Group_((P *)&(pVStack_20->super_View).object);
    local_48 = this;
    pmVar3 = std::
             unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
             ::operator[](&pGVar2->viewing_groups,&local_48);
    *pmVar3 = bVar1;
  }
  return;
}

Assistant:

void Group::_update_visibility(GroupState *state, View *view)
{
    bool view_was_visible = view->get_vis() > get_vis_thr();
    bool view_is_visible = view->update_vis() > get_vis_thr();
    bool cov = view->get_cov();

    // update viewing groups.
    if (state->was_c_active && state->was_c_salient) {
        if (!state->is_c_active || !state->is_c_salient) { // group is not c-active and c-salient anymore: unregister as a viewing group.
            ((Group *)view->object)->viewing_groups.erase(this);
        } else { // group remains c-active and c-salient.
            if (!view_was_visible) {
                if (view_is_visible) { // newly visible view.
                    ((Group *)view->object)->viewing_groups[this] = cov;
                }
            } else {
                if (!view_is_visible) { // the view is no longer visible.
                    ((Group *)view->object)->viewing_groups.erase(this);
                } else { // the view is still visible, cov might have changed.
                    ((Group *)view->object)->viewing_groups[this] = cov;
                }
            }
        }
    } else if (state->is_c_active && state->is_c_salient) { // group becomes c-active and c-salient.
        if (view_is_visible) { // update viewing groups for any visible group.
            ((Group *)view->object)->viewing_groups[this] = cov;
        }
    }
}